

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

SquareMatrix3<double> * OpenMD::operator*(SquareMatrix3<double> *m1,SquareMatrix3<double> *m2)

{
  double *pdVar1;
  RectMatrix<double,_3U,_3U> *in_RDX;
  RectMatrix<double,_3U,_3U> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  double dVar2;
  double dVar3;
  uint k;
  uint j;
  uint i;
  SquareMatrix3<double> *result;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x17c37a);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
        dVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_20,local_28);
        dVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,local_24);
        pdVar1 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_20,local_24);
        *pdVar1 = dVar2 * dVar3 + *pdVar1;
      }
    }
  }
  return (SquareMatrix3<double> *)in_RDI;
}

Assistant:

inline SquareMatrix3<Real> operator*(const SquareMatrix3<Real>& m1,
                                       const SquareMatrix3<Real>& m2) {
    SquareMatrix3<Real> result;

    for (unsigned int i = 0; i < 3; i++)
      for (unsigned int j = 0; j < 3; j++)
        for (unsigned int k = 0; k < 3; k++)
          result(i, j) += m1(i, k) * m2(k, j);

    return result;
  }